

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_highbd_minmax_8x8_c(uint8_t *s8,int p,uint8_t *d8,int dp,int *min,int *max)

{
  int local_54;
  int local_50;
  int diff;
  uint16_t *d;
  uint16_t *s;
  int j;
  int i;
  int *max_local;
  int *min_local;
  int dp_local;
  uint8_t *d8_local;
  int p_local;
  uint8_t *s8_local;
  
  s = (uint16_t *)((long)s8 << 1);
  d = (uint16_t *)((long)d8 << 1);
  *min = 0xffff;
  *max = 0;
  for (i = 0; i < 8; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      local_54 = (uint)s[j] - (uint)d[j];
      if (local_54 < 1) {
        local_54 = -local_54;
      }
      local_50 = local_54;
      if (*min <= local_54) {
        local_50 = *min;
      }
      *min = local_50;
      if (local_54 <= *max) {
        local_54 = *max;
      }
      *max = local_54;
    }
    s = s + p;
    d = d + dp;
  }
  return;
}

Assistant:

void aom_highbd_minmax_8x8_c(const uint8_t *s8, int p, const uint8_t *d8,
                             int dp, int *min, int *max) {
  int i, j;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  const uint16_t *d = CONVERT_TO_SHORTPTR(d8);
  *min = 65535;
  *max = 0;
  for (i = 0; i < 8; ++i, s += p, d += dp) {
    for (j = 0; j < 8; ++j) {
      int diff = abs(s[j] - d[j]);
      *min = diff < *min ? diff : *min;
      *max = diff > *max ? diff : *max;
    }
  }
}